

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreutil.h
# Opt level: O0

path * irr::core::deletePathFromPath(path *filename,s32 pathCount)

{
  u32 uVar1;
  char *pcVar2;
  int in_ESI;
  path *in_RDI;
  char *unaff_retaddr;
  s32 i;
  u32 in_stack_ffffffffffffffec;
  
  uVar1 = string<char>::size((string<char> *)0x382ed7);
  while ((-1 < (int)uVar1 &&
         (((pcVar2 = string<char>::operator[]
                               ((string<char> *)CONCAT44(in_ESI,uVar1),in_stack_ffffffffffffffec),
           *pcVar2 != '/' &&
           (pcVar2 = string<char>::operator[]
                               ((string<char> *)CONCAT44(in_ESI,uVar1),in_stack_ffffffffffffffec),
           *pcVar2 != '\\')) || (in_ESI = in_ESI + -1, 0 < in_ESI))))) {
    uVar1 = uVar1 - 1;
  }
  if ((int)uVar1 < 1) {
    string<char>::operator=((string<char> *)CONCAT44(pathCount,i),unaff_retaddr);
  }
  else {
    pcVar2 = string<char>::operator[]
                       ((string<char> *)CONCAT44(in_ESI,uVar1),in_stack_ffffffffffffffec);
    *pcVar2 = '\0';
    string<char>::validate((string<char> *)CONCAT44(in_ESI,uVar1));
  }
  return in_RDI;
}

Assistant:

inline io::path &deletePathFromPath(io::path &filename, s32 pathCount)
{
	// delete path from filename
	s32 i = filename.size();

	// search for path separator or beginning
	while (i >= 0) {
		if (filename[i] == '/' || filename[i] == '\\') {
			if (--pathCount <= 0)
				break;
		}
		--i;
	}

	if (i > 0) {
		filename[i + 1] = 0;
		filename.validate();
	} else
		filename = "";
	return filename;
}